

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O1

void __thiscall
ASTree::ASTree(ASTree *this,
              stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
              *productions,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *nonTerminals,string *newRoot,ASTree *parent)

{
  pointer pcVar1;
  pointer pbVar2;
  long lVar3;
  const_iterator cVar4;
  int iVar5;
  _Elt_pointer ppPVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  const_iterator cVar8;
  ASTree *pAVar9;
  Production *this_00;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  string prodToJ;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> emptyStack;
  key_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  Production *local_f0;
  string local_e8;
  string local_c8;
  string *local_a8;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *local_a0;
  _Base_ptr local_98;
  ASTree *local_90;
  undefined1 local_88 [24];
  _Elt_pointer ppPStack_70;
  _Elt_pointer local_68;
  _Map_pointer pppPStack_60;
  _Elt_pointer local_58;
  _Elt_pointer ppPStack_50;
  _Elt_pointer local_48;
  _Map_pointer pppPStack_40;
  
  (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = &this->root;
  local_f8 = &(this->root).field_2;
  (this->root)._M_dataplus._M_p = (pointer)local_f8;
  pcVar1 = (newRoot->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar1,pcVar1 + newRoot->_M_string_length);
  this->parent = parent;
  ppPVar6 = (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppPVar6 !=
      (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    if (ppPVar6 ==
        (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppPVar6 = (productions->c).super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this_00 = ppPVar6[-1];
    std::deque<Production_*,_std::allocator<Production_*>_>::pop_back(&productions->c);
    pvVar7 = Production::getToP_abi_cxx11_(this_00);
    uVar10 = (uint)((ulong)((long)(pvVar7->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar7->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)uVar10) {
      local_98 = &(nonTerminals->_M_t)._M_impl.super__Rb_tree_header._M_header;
      uVar11 = (ulong)(uVar10 & 0x7fffffff);
      lVar12 = uVar11 * 0x20 + -0x18;
      local_f0 = this_00;
      local_a0 = productions;
      do {
        pvVar7 = Production::getToP_abi_cxx11_(this_00);
        pbVar2 = (pvVar7->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        lVar3 = *(long *)((long)pbVar2 + lVar12 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,lVar3,
                   *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar12) + lVar3);
        getMarker_abi_cxx11_();
        if (local_118._M_string_length == local_88._8_8_) {
          if (local_118._M_string_length == 0) {
            bVar13 = true;
          }
          else {
            iVar5 = bcmp(local_118._M_dataplus._M_p,(void *)local_88._0_8_,
                         local_118._M_string_length);
            bVar13 = iVar5 == 0;
          }
        }
        else {
          bVar13 = false;
        }
        if ((ASTree *)local_88._0_8_ != (ASTree *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
        if (!bVar13) {
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&nonTerminals->_M_t,&local_118);
          if (cVar8._M_node == local_98) {
            local_48 = (_Elt_pointer)0x0;
            pppPStack_40 = (_Map_pointer)0x0;
            local_58 = (_Elt_pointer)0x0;
            ppPStack_50 = (_Elt_pointer)0x0;
            local_68 = (_Elt_pointer)0x0;
            pppPStack_60 = (_Map_pointer)0x0;
            local_88._16_8_ = (_Elt_pointer)0x0;
            ppPStack_70 = (_Elt_pointer)0x0;
            local_88._0_8_ = (ASTree *)0x0;
            local_88._8_8_ = 0;
            std::_Deque_base<Production_*,_std::allocator<Production_*>_>::_M_initialize_map
                      ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)local_88,0);
            cVar4._M_current =
                 (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pAVar9 = (ASTree *)operator_new(0x40);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,local_118._M_dataplus._M_p,
                       local_118._M_dataplus._M_p + local_118._M_string_length);
            ASTree(pAVar9,(stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                           *)local_88,nonTerminals,&local_e8,this);
            local_90 = pAVar9;
            std::vector<ASTree_*,_std::allocator<ASTree_*>_>::_M_insert_rval
                      (&this->subtrees,cVar4,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
                      ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)local_88);
            this_00 = local_f0;
          }
          else {
            cVar4._M_current =
                 (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
            pAVar9 = (ASTree *)operator_new(0x40);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_118._M_dataplus._M_p,
                       local_118._M_dataplus._M_p + local_118._M_string_length);
            ASTree(pAVar9,local_a0,nonTerminals,&local_c8,this);
            local_88._0_8_ = pAVar9;
            std::vector<ASTree_*,_std::allocator<ASTree_*>_>::_M_insert_rval
                      (&this->subtrees,cVar4,(value_type *)local_88);
            this_00 = local_f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
              this_00 = local_f0;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        lVar12 = lVar12 + -0x20;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  return;
}

Assistant:

ASTree::ASTree(std::stack<Production *> &productions, const std::set<std::string> &nonTerminals, std::string newRoot,
               ASTree *parent) : root(newRoot), parent(parent) {

    if (productions.empty()) { return; }

    Production *production = productions.top();
    productions.pop();

//    root = production->getFromP();

    int totProd = production->getToP().size();
    for (int j = 0; j < totProd; ++j) {

        std::string prodToJ = production->getToP()[totProd-j-1];

        if(prodToJ == getMarker()){
            continue;
        }

        if (nonTerminals.find(prodToJ) != nonTerminals.end()) {
            subtrees.insert(subtrees.begin(), new ASTree(productions, nonTerminals, prodToJ, this));
        } else {
            std::stack<Production *> emptyStack;
            subtrees.insert(subtrees.begin(), new ASTree(emptyStack, nonTerminals, prodToJ, this));
        }
    }

    return;
}